

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Selector.cpp
# Opt level: O1

void __thiscall Selector::threadMain(Selector *this)

{
  ushort uVar1;
  int iVar2;
  bool bVar3;
  bool bVar4;
  uint uVar5;
  Event *ev;
  nfds_t __nfds;
  int i;
  nfds_t nVar6;
  int numFds;
  char buf [10];
  pollfd fds [64];
  int local_264;
  uint *local_260;
  EventQueue *local_258;
  Condition *local_250;
  undefined1 local_242 [10];
  pollfd local_238 [65];
  
  local_264 = 0;
  fillPollFds(this,local_238,&local_264);
  if (this->mRunning == true) {
    local_260 = (uint *)__errno_location();
    local_258 = &(this->super_EventDispatcher).mQueue;
    local_250 = &this->mCondition;
    bVar4 = false;
    do {
      iVar2 = local_264;
      __nfds = (nfds_t)local_264;
      *local_260 = 0;
      uVar5 = poll((pollfd *)local_238,__nfds,-1);
      if (((int)uVar5 < 0) && ((*local_260 & 0xfffffffb) != 0)) {
        jh_log_print(1,"void Selector::threadMain()",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/src/Selector.cpp"
                     ,0xd9,"Poll returned %d",(ulong)uVar5);
      }
      if (0 < iVar2 && 0 < (int)uVar5) {
        nVar6 = 0;
        do {
          uVar1 = local_238[nVar6].revents;
          if (local_238[nVar6].fd == this->mPipe[0]) {
            if ((uVar1 & 1) == 0) {
              if ((uVar1 & 0x30) != 0) {
                jh_log_print(1,"void Selector::threadMain()",
                             "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/src/Selector.cpp"
                             ,0xf5,"POLLHUP recieved on pipe");
              }
            }
            else {
              read(this->mPipe[0],local_242,4);
              bVar4 = true;
            }
          }
          else if (uVar1 != 0) {
            bVar3 = callListeners(this,local_238[nVar6].fd,(int)(short)uVar1);
            if (bVar3) {
              this->mUpdateFds = true;
            }
          }
          nVar6 = nVar6 + 1;
        } while (__nfds != nVar6);
      }
      if (bVar4) {
        ev = EventQueue::PollEvent(local_258);
        if (ev == (Event *)0x0) {
          bVar4 = false;
          jh_log_print(2,"void Selector::threadMain()",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/src/Selector.cpp"
                       ,0x112,"got NULL event");
        }
        else {
          if (*(int *)&(ev->super_RefCount).field_0xc == -4) {
            this->mUpdateFds = true;
            RefCount::Release(&ev->super_RefCount);
          }
          else {
            bVar4 = EventDispatcher::handleEvent(&this->super_EventDispatcher,ev);
            if (bVar4) {
              this->mRunning = false;
            }
          }
          bVar4 = false;
        }
      }
      if (this->mUpdateFds == true) {
        fillPollFds(this,local_238,&local_264);
        this->mUpdateFds = false;
      }
      Condition::Broadcast(local_250);
    } while (this->mRunning != false);
  }
  return;
}

Assistant:

void Selector::threadMain()
{
	TRACE_BEGIN( LOG_LVL_INFO );
	bool gotEvent = false;
	struct pollfd	fds[ kMaxPollFds ];
	int				numFds = 0;
	
	fillPollFds( fds, numFds );
	
	// Event will be sent by EventThread on exit
	while( mRunning )
	{
		LOG( "%p on %d files", this, numFds );
		for ( int i = 1; i < numFds; i++ )
		{
			LOG( "%p fd %d", this, fds[ i ].fd );
		}
		
		// set errno to zero
		// this is being set to better monitor the behavior of poll on
		// the 7401 until poll gets fixed
		errno = 0;
		int res = 0;
		
		// test here to ensure that errno cannot be modified before it is tested.
		if ( ( res = poll( fds, numFds, -1 ) ) < 0 )
		{
			// for whatever reason, there are times when poll returns -1,
			// but doesn't set errno
			if (errno == 0)
				LOG_NOTICE( "Poll returned %d, but didn't set errno", res);
			else if (errno == EINTR)
				LOG_NOISE( "Poll was interrupted" );
			else
				LOG_ERR_PERROR( "Poll returned %d", res );
		}
		
		LOG( "%p woke up %d", this, res );
		
		if ( res > 0 )
		{
			LOG( "got %d from poll", res );
			
			for ( int i = 0; i < numFds; i++ )
			{
				if ( fds[ i ].fd == mPipe[ PIPE_READER ] )
				{
					LOG( "got %x on pipe %d", fds[ 0 ].revents, fds[ i ].fd );
					if ( fds[ i ].revents & POLLIN )
					{
						char buf[10];
						read( mPipe[ PIPE_READER ], &buf, 4 );
						
						// We need to handle events after we handle file
						// descriptor polls because one of the events
						// that we handle modifies the current list of
						// file descriptors for poll and we need to handle
						// any that occured before updating them.
						gotEvent = true;
					}			
					else if ( fds[ i ].revents & ( POLLHUP | POLLNVAL ) )
					{
						LOG_ERR_FATAL( "POLLHUP recieved on pipe" );
					}
				}
				else
				{
					LOG_NOISE( "got %x on fd %d", fds[ i ].revents, fds[ i ].fd );
					if ( fds[ i ].revents != 0 )
					{
						// if callListeners removes a listener we need to update 
						//  Fds.  However only set if callListeners returns true
						//  This should not be cleared since one of the listeners
						//  could have called removeListener and that call might 
						//  have set mUpdateFds
						if ( callListeners( fds[ i ].fd, fds[ i ].revents ) )
							mUpdateFds = true;
					}
				}
			}
		}

		// Now that file descriptors have been handled we can deal with
		// events if needed, including updating the poll file descriptor
		// list if it's been changed.
		if ( gotEvent )
		{
			Event *ev = mQueue.PollEvent();

			if ( ev == NULL )
			{
				LOG_WARN( "got NULL event" );
			}
			else if ( ev->getEventId() == Event::kSelectorUpdateEventId )
			{
				LOG( "got kSelectorUpdateEventId" );
				mUpdateFds = true;
				ev->Release();
			}
			else
			{
				LOG( "got event %d", ev->getEventId() );
				bool done = EventDispatcher::handleEvent( ev );
				if ( done )
					mRunning = false;
			}
			
			gotEvent = false;
		}
		
		if ( mUpdateFds )
		{
			fillPollFds( fds, numFds );
			mUpdateFds = false;
		}
		
		mCondition.Broadcast();
	}
	
	LOG_NOTICE( "Thread exiting" );
}